

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

int PHF::init<phf_string,false>(phf *phf,phf_string *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  int iVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  undefined1 auVar9 [12];
  size_t __nmemb;
  size_t sVar10;
  undefined8 *__base;
  void *__ptr;
  uint32_t *puVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  uint *puVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  size_t sVar26;
  uint uVar27;
  uint uVar28;
  undefined8 *puVar29;
  size_t __nmemb_00;
  undefined8 *puVar30;
  undefined8 *puVar31;
  undefined8 *puVar32;
  void *local_60;
  
  __nmemb_00 = n + (n == 0);
  uVar15 = l + (l == 0);
  sVar10 = 100;
  if (a < 100) {
    sVar10 = a;
  }
  phf->nodiv = false;
  __nmemb = phf_primeup(((uVar15 + __nmemb_00) - 1) / uVar15);
  sVar10 = phf_primeup((__nmemb_00 * 100) / (sVar10 + (sVar10 == 0)));
  if (sVar10 == 0 || __nmemb == 0) {
    return 0x22;
  }
  __base = (undefined8 *)calloc(__nmemb_00,0x20);
  if ((__base == (undefined8 *)0x0) || (local_60 = calloc(__nmemb,8), local_60 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_60 = (void *)0x0;
  }
  else {
    if (n != 0) {
      sVar16 = 0;
LAB_00134095:
      puVar18 = (uint *)k[sVar16].p;
      sVar26 = k[sVar16].n;
      uVar27 = seed;
      do {
        uVar28 = 0;
        uVar23 = 0;
        switch(sVar26) {
        case 0:
          goto switchD_001340f8_caseD_0;
        case 3:
          uVar23 = (uint)*(byte *)((long)puVar18 + 2) << 8;
        case 2:
          uVar28 = uVar23 | (uint)*(byte *)((long)puVar18 + 1) << 0x10;
        case 1:
          uVar27 = (((uint)(byte)*puVar18 << 0x18 | uVar28) * -0x3361d2af >> 0x11 |
                   uVar28 * 0x16a88000) * 0x1b873593 ^ uVar27;
          uVar27 = (uVar27 << 0xd | uVar27 >> 0x13) * 5 + 0xe6546b64;
          goto switchD_001340f8_caseD_0;
        default:
          uVar23 = *puVar18;
          uVar28 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8;
          uVar27 = ((uVar28 | uVar23 << 0x18) * -0x3361d2af >> 0x11 | uVar28 * 0x16a88000) *
                   0x1b873593 ^ uVar27;
          uVar27 = (uVar27 << 0xd | uVar27 >> 0x13) * 5 + 0xe6546b64;
          puVar18 = puVar18 + 1;
          sVar26 = sVar26 - 4;
        }
      } while( true );
    }
LAB_0013419a:
    qsort(__base,__nmemb_00,0x20,phf_keycmp<phf_string>);
    uVar15 = sVar10 + 0x3f >> 6;
    __ptr = calloc(uVar15 * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar11 = (uint32_t *)calloc(__nmemb,4);
      if (puVar11 != (uint32_t *)0x0) {
        iVar3 = 0;
        if ((long)n < 1) {
          uVar25 = 0;
        }
        else {
          uVar25 = 0;
          puVar30 = __base;
          do {
            lVar19 = *(long *)puVar30[3];
            if (lVar19 == 0) break;
            puVar29 = puVar30 + lVar19 * 4;
            if (0 < lVar19) {
              uVar17 = 1;
LAB_00134264:
              iVar14 = (int)uVar17;
              uVar27 = ((uint)(iVar14 * -0x3361d2af) >> 0x11 | iVar14 * 0x16a88000) * 0x1b873593 ^
                       seed;
              uVar27 = (uVar27 << 0xd | uVar27 >> 0x13) * 5 + 0xe6546b64;
              puVar32 = puVar30;
LAB_0013428f:
              puVar18 = (uint *)*puVar32;
              lVar20 = puVar32[1];
              uVar23 = uVar27;
              do {
                uVar24 = 0;
                uVar28 = 0;
                switch(lVar20) {
                case 0:
                  goto switchD_001342e2_caseD_0;
                case 3:
                  uVar28 = (uint)*(byte *)((long)puVar18 + 2) << 8;
                case 2:
                  uVar24 = uVar28 | (uint)*(byte *)((long)puVar18 + 1) << 0x10;
                case 1:
                  uVar23 = (((uint)(byte)*puVar18 << 0x18 | uVar24) * -0x3361d2af >> 0x11 |
                           uVar24 * 0x16a88000) * 0x1b873593 ^ uVar23;
                  uVar23 = (uVar23 << 0xd | uVar23 >> 0x13) * 5 + 0xe6546b64;
                  goto switchD_001342e2_caseD_0;
                default:
                  uVar28 = *puVar18;
                  uVar24 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8;
                  uVar23 = ((uVar24 | uVar28 << 0x18) * -0x3361d2af >> 0x11 | uVar24 * 0x16a88000) *
                           0x1b873593 ^ uVar23;
                  uVar23 = (uVar23 << 0xd | uVar23 >> 0x13) * 5 + 0xe6546b64;
                  puVar18 = puVar18 + 1;
                  lVar20 = lVar20 + -4;
                }
              } while( true );
            }
            uVar17 = 1;
LAB_001345a1:
            uVar25 = uVar25 & 0xffffffff;
            if (uVar25 < uVar17) {
              uVar25 = uVar17;
            }
            puVar11[*(uint *)(puVar30 + 2)] = (uint32_t)uVar17;
            puVar30 = puVar29;
          } while (puVar29 < __base + n * 4);
          uVar25 = uVar25 & 0xffffffff;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar10;
        phf->g = puVar11;
        phf->d_max = uVar25;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_001345d8;
      }
    }
  }
  piVar13 = __errno_location();
  iVar3 = *piVar13;
LAB_001345d8:
  free(__ptr);
  free(local_60);
  free(__base);
  return iVar3;
switchD_001340f8_caseD_0:
  uVar27 = (uVar27 >> 0x10 ^ uVar27) * -0x7a143595;
  uVar27 = (uVar27 >> 0xd ^ uVar27) * -0x3d4d51cb;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = __nmemb;
  auVar9._4_8_ = 0;
  auVar9._0_4_ = uVar27 >> 0x10 ^ uVar27;
  lVar19 = SUB128(auVar9 % auVar4,0);
  sVar26 = k[sVar16].n;
  __base[sVar16 * 4] = k[sVar16].p;
  (__base + sVar16 * 4)[1] = sVar26;
  *(int *)(__base + sVar16 * 4 + 2) = SUB124(auVar9 % auVar4,0);
  plVar1 = (long *)((long)local_60 + lVar19 * 8);
  *plVar1 = *plVar1 + 1;
  __base[sVar16 * 4 + 3] = (void *)((long)local_60 + lVar19 * 8);
  sVar16 = sVar16 + 1;
  if (sVar16 == n) goto LAB_0013419a;
  goto LAB_00134095;
switchD_001342e2_caseD_0:
  uVar23 = (uVar23 >> 0x10 ^ uVar23) * -0x7a143595;
  uVar23 = (uVar23 >> 0xd ^ uVar23) * -0x3d4d51cb;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar10;
  auVar5 = ZEXT416(uVar23 >> 0x10 ^ uVar23) % auVar5;
  uVar21 = auVar5._0_8_;
  uVar12 = uVar21 >> 6 & 0x3ffffff;
  uVar22 = 1L << (auVar5[0] & 0x3f);
  puVar31 = puVar30;
  if (((*(ulong *)((long)__ptr + uVar12 * 8) >> (uVar21 & 0x3f) & 1) != 0) ||
     (uVar21 = *(ulong *)((long)__ptr + uVar12 * 8 + uVar15 * 8), (uVar21 & uVar22) != 0))
  goto LAB_00134387;
  *(ulong *)((long)__ptr + uVar12 * 8 + uVar15 * 8) = uVar21 | uVar22;
  puVar32 = puVar32 + 4;
  if (puVar29 <= puVar32) {
    if (lVar19 < 1) goto LAB_001345a1;
    uVar27 = ((uint)(iVar14 * -0x3361d2af) >> 0x11 | iVar14 * 0x16a88000) * 0x1b873593 ^ seed;
    puVar32 = puVar30;
    goto LAB_001344ad;
  }
  goto LAB_0013428f;
LAB_00134387:
  puVar18 = (uint *)*puVar31;
  lVar20 = puVar31[1];
  uVar23 = uVar27;
  do {
    uVar24 = 0;
    uVar28 = 0;
    switch(lVar20) {
    case 0:
      goto switchD_001343da_caseD_0;
    case 3:
      uVar28 = (uint)*(byte *)((long)puVar18 + 2) << 8;
    case 2:
      uVar24 = uVar28 | (uint)*(byte *)((long)puVar18 + 1) << 0x10;
    case 1:
      uVar23 = (((uint)(byte)*puVar18 << 0x18 | uVar24) * -0x3361d2af >> 0x11 | uVar24 * 0x16a88000)
               * 0x1b873593 ^ uVar23;
      uVar23 = (uVar23 << 0xd | uVar23 >> 0x13) * 5 + 0xe6546b64;
      goto switchD_001343da_caseD_0;
    default:
      uVar28 = *puVar18;
      uVar24 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8;
      uVar23 = ((uVar24 | uVar28 << 0x18) * -0x3361d2af >> 0x11 | uVar24 * 0x16a88000) * 0x1b873593
               ^ uVar23;
      uVar23 = (uVar23 << 0xd | uVar23 >> 0x13) * 5 + 0xe6546b64;
      puVar18 = puVar18 + 1;
      lVar20 = lVar20 + -4;
    }
  } while( true );
switchD_001343da_caseD_0:
  uVar23 = (uVar23 >> 0x10 ^ uVar23) * -0x7a143595;
  uVar23 = (uVar23 >> 0xd ^ uVar23) * -0x3d4d51cb;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar10;
  auVar6 = ZEXT416(uVar23 >> 0x10 ^ uVar23) % auVar6;
  bVar8 = auVar6[0] & 0x3f;
  puVar2 = (ulong *)((long)__ptr + (auVar6._0_8_ >> 6 & 0x3ffffff) * 8 + uVar15 * 8);
  *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
  puVar31 = puVar31 + 4;
  if (puVar29 <= puVar31) goto code_r0x0013445f;
  goto LAB_00134387;
code_r0x0013445f:
  uVar17 = uVar17 + 1;
  goto LAB_00134264;
LAB_001344ad:
  puVar18 = (uint *)*puVar32;
  lVar19 = puVar32[1];
  uVar23 = uVar27 << 0xd | uVar27 >> 0x13;
  do {
    uVar23 = uVar23 * 5 + 0xe6546b64;
    uVar24 = 0;
    uVar28 = 0;
    switch(lVar19) {
    case 0:
      goto switchD_00134507_caseD_0;
    case 3:
      uVar28 = (uint)*(byte *)((long)puVar18 + 2) << 8;
    case 2:
      uVar24 = uVar28 | (uint)*(byte *)((long)puVar18 + 1) << 0x10;
    case 1:
      uVar23 = (((uint)(byte)*puVar18 << 0x18 | uVar24) * -0x3361d2af >> 0x11 | uVar24 * 0x16a88000)
               * 0x1b873593 ^ uVar23;
      uVar23 = (uVar23 << 0xd | uVar23 >> 0x13) * 5 + 0xe6546b64;
      goto switchD_00134507_caseD_0;
    default:
      uVar28 = *puVar18;
      uVar24 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8;
      uVar23 = ((uVar24 | uVar28 << 0x18) * -0x3361d2af >> 0x11 | uVar24 * 0x16a88000) * 0x1b873593
               ^ uVar23;
      uVar23 = uVar23 << 0xd | uVar23 >> 0x13;
      puVar18 = puVar18 + 1;
      lVar19 = lVar19 + -4;
    }
  } while( true );
switchD_00134507_caseD_0:
  uVar23 = (uVar23 >> 0x10 ^ uVar23) * -0x7a143595;
  uVar23 = (uVar23 >> 0xd ^ uVar23) * -0x3d4d51cb;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar10;
  auVar7 = ZEXT416(uVar23 >> 0x10 ^ uVar23) % auVar7;
  puVar2 = (ulong *)((long)__ptr + (auVar7._0_8_ >> 6 & 0x3ffffff) * 8);
  *puVar2 = *puVar2 | 1L << (auVar7[0] & 0x3f);
  puVar32 = puVar32 + 4;
  if (puVar29 <= puVar32) goto LAB_001345a1;
  goto LAB_001344ad;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}